

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O2

Entry * __thiscall
Lib::
DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
::findEntryToInsert(DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
                    *this,TermList *key)

{
  uint uVar1;
  Entry *pEVar2;
  ulong uVar3;
  int iVar4;
  
  ensureExpanded(this);
  uVar1 = Kernel::TermList::defaultHash(key);
  uVar3 = (ulong)uVar1 % (ulong)(uint)this->_capacity;
  pEVar2 = this->_entries + (int)uVar3;
  uVar1 = this->_entries[(int)uVar3].field_0._infoData;
  if ((uVar1 >> 2 == this->_timestamp) && ((pEVar2->_key)._content != key->_content)) {
    (pEVar2->field_0)._infoData = uVar1 | 2;
    iVar4 = (int)((key->_content & 0xffffffff) % (ulong)(uint)this->_capacity);
    do {
      uVar3 = (ulong)((int)uVar3 + iVar4 + (uint)(iVar4 == 0)) % (ulong)(uint)this->_capacity;
      pEVar2 = this->_entries + (int)uVar3;
      if ((uint)this->_entries[(int)uVar3].field_0._infoData >> 2 != this->_timestamp) {
        return pEVar2;
      }
    } while ((pEVar2->_key)._content != key->_content);
  }
  return pEVar2;
}

Assistant:

Entry* findEntryToInsert(Key const& key)
  {
    ensureExpanded();
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    int pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp || res->_key==key) {
      return res;
    }

    //We have a collision...

    //mark the entry where the collision occured
    res->_info.collision=1;

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);
    return res;
  }